

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O3

void __thiscall
OpenMD::SCDOrderParameter::SCDOrderParameter
          (SCDOrderParameter *this,SimInfo *info,string *filename,string *molname,int beginIndex,
          int endIndex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __s;
  pointer pdVar2;
  SCDOrderParameter *pSVar3;
  long *plVar4;
  size_type *psVar5;
  bool bVar6;
  string selectionTemplate;
  string sele1;
  string sele3;
  string sele2;
  string local_158;
  SCDOrderParameter *local_138;
  vector<double,_std::allocator<double>_> *local_130;
  vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *local_128;
  string local_120;
  string local_100;
  string local_e0;
  SCDElem local_c0;
  SimInfo *local_40;
  string *local_38;
  
  local_40 = info;
  local_38 = molname;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__SCDOrderParameter_003376b8
  ;
  local_128 = &this->scdElems_;
  local_130 = &this->scdParam_;
  (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = this;
  getPrefix(&local_158,filename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
  paVar1 = &local_c0.sele1_.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_c0.sele1_.field_2._M_allocated_capacity = *psVar5;
    local_c0.sele1_.field_2._8_8_ = plVar4[3];
    local_c0.sele1_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.sele1_.field_2._M_allocated_capacity = *psVar5;
    local_c0.sele1_._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c0.sele1_._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(local_138->super_StaticAnalyser).outputFilename_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.sele1_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.sele1_._M_dataplus._M_p,
                    local_c0.sele1_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (beginIndex <= (int)(endIndex - 2U)) {
    do {
      std::operator+(&local_c0.sele1_,"select ",local_38);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158.field_2._8_8_ = plVar4[3];
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_158._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele1_._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.sele1_._M_dataplus._M_p,
                        local_c0.sele1_.field_2._M_allocated_capacity + 1);
      }
      OpenMD_itoa_abi_cxx11_(&local_c0.sele1_,(OpenMD *)(ulong)(uint)beginIndex,10,(uint)psVar5);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_120.field_2._M_allocated_capacity = *psVar5;
        local_120.field_2._8_8_ = plVar4[3];
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar5;
        local_120._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_120._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele1_._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.sele1_._M_dataplus._M_p,
                        local_c0.sele1_.field_2._M_allocated_capacity + 1);
      }
      OpenMD_itoa_abi_cxx11_(&local_c0.sele1_,(OpenMD *)(ulong)(beginIndex + 1),10,(uint)psVar5);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        local_e0.field_2._8_8_ = plVar4[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        local_e0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele1_._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.sele1_._M_dataplus._M_p,
                        local_c0.sele1_.field_2._M_allocated_capacity + 1);
      }
      OpenMD_itoa_abi_cxx11_(&local_c0.sele1_,(OpenMD *)(ulong)(beginIndex + 2),10,(uint)psVar5);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_100.field_2._M_allocated_capacity = *psVar5;
        local_100.field_2._8_8_ = plVar4[3];
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar5;
        local_100._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_100._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele1_._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.sele1_._M_dataplus._M_p,
                        local_c0.sele1_.field_2._M_allocated_capacity + 1);
      }
      SCDElem::SCDElem(&local_c0,local_40,&local_120,&local_e0,&local_100);
      std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::emplace_back<OpenMD::SCDElem>
                (local_128,&local_c0);
      if (local_c0.tuples_.
          super__Vector_base<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.tuples_.
                        super__Vector_base<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.tuples_.
                              super__Vector_base<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.tuples_.
                              super__Vector_base<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::tuple<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele3_._M_dataplus._M_p != &local_c0.sele3_.field_2) {
        operator_delete(local_c0.sele3_._M_dataplus._M_p,
                        local_c0.sele3_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele2_._M_dataplus._M_p != &local_c0.sele2_.field_2) {
        operator_delete(local_c0.sele2_._M_dataplus._M_p,
                        local_c0.sele2_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.sele1_._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.sele1_._M_dataplus._M_p,
                        local_c0.sele1_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      bVar6 = beginIndex != endIndex - 2U;
      beginIndex = beginIndex + 1;
    } while (bVar6);
  }
  pSVar3 = local_138;
  std::vector<double,_std::allocator<double>_>::resize
            (local_130,
             (long)(local_138->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_138->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_start >> 7);
  __s = (pSVar3->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar2 = (pSVar3->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar2) {
    memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  return;
}

Assistant:

SCDOrderParameter::SCDOrderParameter(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& molname,
                                       int beginIndex, int endIndex) :
      StaticAnalyser(info, filename, 1) {
    setOutputName(getPrefix(filename) + ".scd");

    assert(beginIndex >= 0 && endIndex >= 0 && beginIndex <= endIndex - 2);
    for (int i = beginIndex; i <= endIndex - 2; ++i) {
      std::string selectionTemplate = "select " + molname + ".";
      std::string sele1             = selectionTemplate + OpenMD_itoa(i);
      std::string sele2             = selectionTemplate + OpenMD_itoa(i + 1);
      std::string sele3             = selectionTemplate + OpenMD_itoa(i + 2);

      scdElems_.push_back(SCDElem(info, sele1, sele2, sele3));
    }

    scdParam_.resize(scdElems_.size());
    std::fill(scdParam_.begin(), scdParam_.end(), 0.0);
  }